

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void * lua_upvalueid(lua_State *L,int fidx,int n)

{
  uint uVar1;
  TValue *pTVar2;
  UpVal **ppUVar3;
  CClosure *f;
  StkId fi;
  int n_local;
  int fidx_local;
  lua_State *L_local;
  
  pTVar2 = index2addr(L,fidx);
  uVar1 = pTVar2->tt_ & 0x3f;
  if (uVar1 == 6) {
    ppUVar3 = getupvalref(L,fidx,n,(LClosure **)0x0);
    L_local = (lua_State *)*ppUVar3;
  }
  else if (uVar1 == 0x26) {
    L_local = (lua_State *)((pTVar2->value_).f + (long)(n + -1) * 0x10 + 0x20);
  }
  else {
    L_local = (lua_State *)0x0;
  }
  return L_local;
}

Assistant:

LUA_API void *lua_upvalueid(lua_State *L, int fidx, int n) {
    StkId fi = index2addr(L, fidx);
    switch (ttype(fi)) {
        case LUA_TLCL: {  /* lua closure */
            return *getupvalref(L, fidx, n, NULL);
        }
        case LUA_TCCL: {  /* C closure */
            CClosure *f = clCvalue(fi);
            api_check(L, 1 <= n && n <= f->nupvalues, "invalid upvalue index");
            return &f->upvalue[n - 1];
        }
        default: {
            api_check(L, 0, "closure expected");
            return NULL;
        }
    }
}